

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_SecureChannelManager_init(UA_SecureChannelManager *cm,UA_Server *server)

{
  (cm->channels).lh_first = (channel_list_entry *)0x0;
  cm->lastTokenId = 1;
  cm->currentChannelCount = 0;
  cm->lastChannelId = 1;
  cm->server = server;
  return 0;
}

Assistant:

UA_StatusCode
UA_SecureChannelManager_init(UA_SecureChannelManager *cm, UA_Server *server) {
    LIST_INIT(&cm->channels);
    cm->lastChannelId = STARTCHANNELID;
    cm->lastTokenId = STARTTOKENID;
    cm->currentChannelCount = 0;
    cm->server = server;
    return UA_STATUSCODE_GOOD;
}